

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void call_return(ch_context *context)

{
  ch_primitive *last;
  ch_call *pcVar1;
  uint uVar2;
  ch_call *call;
  ch_primitive *stack_pos;
  ch_context *context_local;
  
  last = ch_stack_get(&context->stack,
                      (context->call_stack).calls[(context->call_stack).size - 1].stack_addr);
  close_upvalues(context,last);
  uVar2 = (context->call_stack).size - 1;
  (context->call_stack).size = uVar2;
  pcVar1 = (context->call_stack).calls + uVar2;
  context->pcurrent = pcVar1->return_addr;
  ch_stack_seekto(&context->stack,pcVar1->stack_addr);
  return;
}

Assistant:

static void call_return(ch_context *context) {
  ch_primitive* stack_pos = ch_stack_get(&context->stack, CURRENT_CALL(context).stack_addr);
  close_upvalues(context, stack_pos);

  ch_call *call = &context->call_stack.calls[--context->call_stack.size];
  context->pcurrent = call->return_addr;

  // TODO check result of call
  ch_stack_seekto(&context->stack, call->stack_addr);
}